

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

char __thiscall
cs_impl::
cni_helper<char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
::_call<0>(cni_helper<char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_char_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
           *this,vector *args,sequence<0> *param_3)

{
  char *pcVar1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *in_RDI;
  var *in_stack_00000100;
  undefined7 in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe7;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
  try_convert_and_check<std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>,_0UL>
  ::convert(in_stack_00000100);
  std::function<char_(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>::
  operator()((function<char_(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
              *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_RDI);
  pcVar1 = type_convertor<char,_char>::convert<char>(&stack0xffffffffffffffe7);
  return *pcVar1;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}